

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O2

base_uint<256U> * __thiscall base_uint<256U>::operator+=(base_uint<256U> *this,uint64_t b64)

{
  long in_FS_OFFSET;
  base_uint<256U> b;
  base_uint<256U> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(&local_40);
  operator=(&local_40,b64);
  operator+=(this,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator+=(uint64_t b64)
    {
        base_uint b;
        b = b64;
        *this += b;
        return *this;
    }